

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perseus.cpp
# Opt level: O0

void __thiscall Perseus::PlanLeadIn(Perseus *this)

{
  int iVar1;
  ostream *poVar2;
  Perseus *in_RDI;
  int nrB;
  Perseus *in_stack_ffffffffffffff68;
  TimedAlgorithm *in_stack_ffffffffffffff70;
  string local_58 [32];
  uint local_38;
  string local_28 [24];
  Perseus *in_stack_fffffffffffffff0;
  
  GetIdentification_abi_cxx11_(in_stack_ffffffffffffff68);
  TimedAlgorithm::StartTimer(in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_28);
  if ((in_RDI->_m_beliefsInitialized & 1U) == 0) {
    local_38 = 1000;
    srand(0x2a);
    iVar1 = GetVerbose(in_RDI);
    if (-1 < iVar1) {
      GetIdentification_abi_cxx11_(in_stack_ffffffffffffff68);
      poVar2 = std::operator<<((ostream *)&std::cout,local_58);
      poVar2 = std::operator<<(poVar2,": sampling ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
      std::operator<<(poVar2," beliefs");
      std::__cxx11::string::~string(local_58);
    }
    std::ostream::flush();
    (*in_RDI->_vptr_Perseus[1])(in_RDI,(ulong)local_38,1);
    iVar1 = GetVerbose(in_RDI);
    if (-1 < iVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,".");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  PrintMaxRewardInBeliefSet(in_stack_fffffffffffffff0);
  return;
}

Assistant:

void Perseus::PlanLeadIn()
{
    StartTimer(GetIdentification());

    if(!_m_beliefsInitialized)
    {
        int nrB=1000;
        // set the random seed and sample beliefs
        srand(42);
        if(GetVerbose() >= 0)
            cout << GetIdentification() << ": sampling " << nrB
                 << " beliefs"; cout.flush();
        InitializeBeliefs(nrB,true);
        if(GetVerbose() >= 0)
            cout << "." << endl;
    }

    // just a manual check to figure out if the belief set has potential
    PrintMaxRewardInBeliefSet();
}